

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

void cmFortranParser_RuleLineDirective(cmFortranParser *parser,char *filename)

{
  bool bVar1;
  allocator local_31;
  string included;
  
  std::__cxx11::string::string((string *)&included,filename,&local_31);
  if ((included._M_string_length != 0) && (*included._M_dataplus._M_p != '<')) {
    cmsys::SystemTools::ReplaceString(&included,"\\\\","\\");
    cmsys::SystemTools::ConvertToUnixSlashes(&included);
    bVar1 = cmsys::SystemTools::FileExists(&included,true);
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&parser->Info->Includes,&included);
    }
  }
  std::__cxx11::string::~string((string *)&included);
  return;
}

Assistant:

void cmFortranParser_RuleLineDirective(cmFortranParser* parser,
                                       const char* filename)
{
  // This is a #line directive naming a file encountered during preprocessing.
  std::string included = filename;

  // Skip #line directives referencing non-files like
  // "<built-in>" or "<command-line>".
  if (included.empty() || included[0] == '<') {
    return;
  }

  // Fix windows file path separators since our lexer does not
  // process escape sequences in string literals.
  cmSystemTools::ReplaceString(included, "\\\\", "\\");
  cmSystemTools::ConvertToUnixSlashes(included);

  // Save the named file as included in the source.
  if (cmSystemTools::FileExists(included, true)) {
    parser->Info.Includes.insert(included);
  }
}